

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O0

void checkARCAccessors(Class cls)

{
  BOOL BVar1;
  Class poVar2;
  Class owner;
  Class cls_local;
  
  checkFastAllocInit(cls);
  if (checkARCAccessors::retain == (SEL)0x0) {
    checkARCAccessors::retain = sel_registerName("retain");
    checkARCAccessors::release = sel_registerName("release");
    checkARCAccessors::autorelease = sel_registerName("autorelease");
    checkARCAccessors::isARC = sel_registerName("_ARCCompliantRetainRelease");
  }
  poVar2 = ownerForMethod(cls,checkARCAccessors::retain);
  if ((poVar2 != (Class)0x0) && (BVar1 = ownsMethod(poVar2,checkARCAccessors::isARC), BVar1 == '\0')
     ) {
    objc_clear_class_flag(cls,objc_class_flag_fast_arc);
    return;
  }
  poVar2 = ownerForMethod(cls,checkARCAccessors::release);
  if ((poVar2 != (Class)0x0) && (BVar1 = ownsMethod(poVar2,checkARCAccessors::isARC), BVar1 == '\0')
     ) {
    objc_clear_class_flag(cls,objc_class_flag_fast_arc);
    return;
  }
  poVar2 = ownerForMethod(cls,checkARCAccessors::autorelease);
  if ((poVar2 != (Class)0x0) && (BVar1 = ownsMethod(poVar2,checkARCAccessors::isARC), BVar1 == '\0')
     ) {
    objc_clear_class_flag(cls,objc_class_flag_fast_arc);
    return;
  }
  objc_set_class_flag(cls,objc_class_flag_fast_arc);
  return;
}

Assistant:

static void checkARCAccessors(Class cls)
{
	checkFastAllocInit(cls);
	static SEL retain, release, autorelease, isARC;
	if (NULL == retain)
	{
		retain = sel_registerName("retain");
		release = sel_registerName("release");
		autorelease = sel_registerName("autorelease");
		isARC = sel_registerName("_ARCCompliantRetainRelease");
	}
	Class owner = ownerForMethod(cls, retain);
	if ((NULL != owner) && !ownsMethod(owner, isARC))
	{
		ARC_DEBUG_LOG("%s does not support ARC correctly (implements retain)\n", cls->name);
		objc_clear_class_flag(cls, objc_class_flag_fast_arc);
		return;
	}
	owner = ownerForMethod(cls, release);
	if ((NULL != owner) && !ownsMethod(owner, isARC))
	{
		ARC_DEBUG_LOG("%s does not support ARC correctly (implements release)\n", cls->name);
		objc_clear_class_flag(cls, objc_class_flag_fast_arc);
		return;
	}
	owner = ownerForMethod(cls, autorelease);
	if ((NULL != owner) && !ownsMethod(owner, isARC))
	{
		ARC_DEBUG_LOG("%s does not support ARC correctly (implements autorelease)\n", cls->name);
		objc_clear_class_flag(cls, objc_class_flag_fast_arc);
		return;
	}
	objc_set_class_flag(cls, objc_class_flag_fast_arc);
}